

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::clearshrink_test::test_method(clearshrink_test *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<bool> __l_00;
  initializer_list<int> __l_01;
  bool bVar1;
  undefined1 uVar2;
  lazy_ostream *plVar3;
  long in_FS_OFFSET;
  deque<int,_std::allocator<int>_> v_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  vector<bool,_std::allocator<bool>_> v_1;
  char *in_stack_fffffffffffffc48;
  lazy_ostream *in_stack_fffffffffffffc50;
  basic_cstring<const_char> *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  lazy_ostream *in_stack_fffffffffffffc78;
  const_string *in_stack_fffffffffffffc80;
  const_string *file;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc88;
  deque<int,_std::allocator<int>_> *this_00;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  size_type in_stack_fffffffffffffc98;
  lazy_ostream local_2a4;
  undefined1 local_288 [71];
  deque<int,_std::allocator<int>_> local_241;
  lazy_ostream local_1ec;
  undefined1 local_1d0 [68];
  lazy_ostream local_18c;
  undefined1 local_170 [68];
  lazy_ostream local_12c;
  undefined1 local_110 [68];
  lazy_ostream local_cc;
  undefined1 local_b0 [98];
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b = 1;
  local_1a = 2;
  local_19 = 3;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc48);
  __l._M_array._7_1_ = in_stack_fffffffffffffc97;
  __l._M_array._0_7_ = in_stack_fffffffffffffc90;
  __l._M_len = in_stack_fffffffffffffc98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc88,__l,
             (allocator_type *)in_stack_fffffffffffffc80);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc48);
  ClearShrink<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
               (size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc50,(char (*) [1])in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    local_cc._4_8_ =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffc48);
    local_cc._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffc58 = (basic_cstring<const_char> *)0x1d1f9c0;
    in_stack_fffffffffffffc50 = &local_cc;
    in_stack_fffffffffffffc48 = "v.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_b0,&local_cc.field_0xc,0x718,1,2,
               (undefined1 *)((long)&local_cc._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
               (size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc50,(char (*) [1])in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    local_12c._4_8_ =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::capacity
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffc48);
    local_12c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffc58 = (basic_cstring<const_char> *)0x1d1f9c0;
    in_stack_fffffffffffffc50 = &local_12c;
    in_stack_fffffffffffffc48 = "v.capacity()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_110,&local_12c.field_0xc,0x719,1,2,
               (undefined1 *)((long)&local_12c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc58);
  local_4e = 0;
  local_4d = 1;
  local_4c = 0;
  local_4b = 0;
  local_4a = 1;
  local_49 = 1;
  std::allocator<bool>::allocator((allocator<bool> *)in_stack_fffffffffffffc48);
  __l_00._M_array._7_1_ = in_stack_fffffffffffffc97;
  __l_00._M_array._0_7_ = in_stack_fffffffffffffc90;
  __l_00._M_len = in_stack_fffffffffffffc98;
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffc88,__l_00,(allocator_type *)in_stack_fffffffffffffc80);
  std::allocator<bool>::~allocator((allocator<bool> *)in_stack_fffffffffffffc48);
  ClearShrink<std::vector<bool,std::allocator<bool>>>
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc48);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
               (size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc50,(char (*) [1])in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    local_18c._4_8_ =
         std::vector<bool,_std::allocator<bool>_>::size
                   ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc58);
    local_18c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffc58 = (basic_cstring<const_char> *)0x1d1f9c0;
    in_stack_fffffffffffffc50 = &local_18c;
    in_stack_fffffffffffffc48 = "v.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_170,&local_18c.field_0xc,0x71f,1,2,
               (undefined1 *)((long)&local_18c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc48);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
               (size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc50,(char (*) [1])in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    local_1ec._4_8_ =
         std::vector<bool,_std::allocator<bool>_>::capacity
                   ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc58);
    local_1ec._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffc58 = (basic_cstring<const_char> *)0x1d1f9c0;
    in_stack_fffffffffffffc50 = &local_1ec;
    in_stack_fffffffffffffc48 = "v.capacity()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_1d0,&local_1ec.field_0xc,0x720,1,2,
               (undefined1 *)((long)&local_1ec._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc48);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc48);
  local_18 = 1;
  local_14 = 3;
  local_10 = 3;
  local_c = 7;
  this_00 = &local_241;
  std::allocator<int>::allocator((allocator<int> *)in_stack_fffffffffffffc48);
  __l_01._M_array._7_1_ = uVar2;
  __l_01._M_array._0_7_ = in_stack_fffffffffffffc90;
  __l_01._M_len = (size_type)plVar3;
  std::deque<int,_std::allocator<int>_>::deque
            (this_00,__l_01,(allocator_type *)in_stack_fffffffffffffc80);
  std::allocator<int>::~allocator((allocator<int> *)in_stack_fffffffffffffc48);
  ClearShrink<std::deque<int,std::allocator<int>>>
            ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffc48);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc48);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,(size_t)in_stack_fffffffffffffc78,
               (const_string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    in_stack_fffffffffffffc78 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc50,(char (*) [1])in_stack_fffffffffffffc48);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (in_stack_fffffffffffffc58,(pointer)in_stack_fffffffffffffc50,
               (unsigned_long)in_stack_fffffffffffffc48);
    local_2a4._4_8_ =
         std::deque<int,_std::allocator<int>_>::size
                   ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffc48);
    local_2a4._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffc58 = (basic_cstring<const_char> *)0x1d1f9c0;
    in_stack_fffffffffffffc50 = &local_2a4;
    in_stack_fffffffffffffc48 = "v.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_288,&local_2a4.field_0xc,0x726,1,2,
               (undefined1 *)((long)&local_2a4._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc48);
    in_stack_fffffffffffffc77 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc77);
  std::deque<int,_std::allocator<int>_>::~deque
            ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffc58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(clearshrink_test)
{
    {
        std::vector<uint8_t> v = {1, 2, 3};
        ClearShrink(v);
        BOOST_CHECK_EQUAL(v.size(), 0);
        BOOST_CHECK_EQUAL(v.capacity(), 0);
    }

    {
        std::vector<bool> v = {false, true, false, false, true, true};
        ClearShrink(v);
        BOOST_CHECK_EQUAL(v.size(), 0);
        BOOST_CHECK_EQUAL(v.capacity(), 0);
    }

    {
        std::deque<int> v = {1, 3, 3, 7};
        ClearShrink(v);
        BOOST_CHECK_EQUAL(v.size(), 0);
        // std::deque has no capacity() we can observe.
    }
}